

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_block.cpp
# Opt level: O3

void msd_D<1024u>(uchar **strings,size_t n,size_t depth)

{
  size_t *psVar1;
  byte bVar2;
  ulong uVar3;
  _List_node_base *__dest;
  size_t n_00;
  pointer ppppuVar4;
  uint j;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  long lVar7;
  long lVar8;
  _List_node_base *p_Var9;
  ulong uVar10;
  uint i;
  long lVar11;
  uchar **ppuVar12;
  _List_node_base *__dest_00;
  size_t depth_00;
  size_t i_1;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  BackLinks backlinks;
  uchar cache [32];
  array<unsigned_long,_256UL> bucketsize;
  vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> local_888;
  size_t local_870;
  ulong local_868;
  long local_860;
  byte abStack_858 [40];
  ulong local_830;
  size_t local_828 [255];
  
  if (n < 0x10000) {
    msd_CE2_16bit(strings,n,depth);
    return;
  }
  if (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_ == '\0') {
    msd_D<1024u>();
  }
  if (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_ == '\0') {
    msd_D<1024u>();
  }
  std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::vector
            (&local_888,(n >> 10) + 1,(allocator_type *)&local_830);
  lVar11 = 0;
  do {
    (&local_830)[lVar11] = 0;
    p_Var5 = (_List_node_base *)
             (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems
             + lVar11);
    p_Var6 = (((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)&p_Var5->_M_next)
             ->_M_impl)._M_node.super__List_node_base._M_next;
    while (p_Var6 != p_Var5) {
      p_Var9 = p_Var6->_M_next;
      operator_delete(p_Var6);
      p_Var6 = p_Var9;
    }
    msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems[lVar11].
    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
    super__List_node_base._M_prev = p_Var5;
    p_Var5->_M_next = p_Var5;
    msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems[lVar11].
    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size =
         0;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x100);
  lVar11 = 0;
  do {
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)((long)msd_D<1024U>::temp_space._M_elems + lVar11);
    std::__detail::_List_node_base::_M_hook(p_Var5);
    msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size =
         msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
         super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
         _M_size + 1;
    lVar11 = lVar11 + 0x2000;
  } while (lVar11 != 0x20c000);
  uVar13 = 0;
  p_Var5 = (_List_node_base *)strings;
  do {
    p_Var6 = (_List_node_base *)operator_new(0x18);
    p_Var6[1]._M_next = p_Var5;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size =
         msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
         super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
         _M_size + 1;
    uVar13 = uVar13 + 0x400;
    p_Var5 = p_Var5 + 0x200;
  } while (uVar13 < n - 0x400);
  local_868 = n & 0xffffffffffffffe0;
  local_870 = depth;
  if (local_868 == 0) {
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    ppuVar12 = strings;
    do {
      lVar11 = 0;
      do {
        abStack_858[lVar11] = ppuVar12[lVar11][local_870];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x20);
      lVar11 = 0;
      do {
        p_Var5 = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
                 super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 _M_node.super__List_node_base._M_next;
        bVar2 = abStack_858[lVar11];
        uVar3 = (&local_830)[bVar2];
        uVar14 = uVar3 & 0x3ff;
        if (uVar14 == 0) {
          if (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
              super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
              super__List_node_base._M_next ==
              (_List_node_base *)
              &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_)
          goto LAB_002040b8;
          p_Var6 = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
                   super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   _M_node.super__List_node_base._M_next[1]._M_next;
          msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
          super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
          _M_size = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_
                    .super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node._M_size - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var5);
          p_Var5 = (_List_node_base *)operator_new(0x18);
          p_Var5[1]._M_next = p_Var6;
          std::__detail::_List_node_base::_M_hook(p_Var5);
          psVar1 = &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_.
                    _M_elems[bVar2].
                    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if (p_Var6 < (_List_node_base *)(strings + n) && strings <= p_Var6) {
            lVar7 = (long)p_Var6 - (long)strings >> 3;
            lVar8 = lVar7 + 0x3ff;
            if (-1 < lVar7) {
              lVar8 = lVar7;
            }
            local_888.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar8 >> 10] =
                 (uchar ***)
                 (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_.
                  _M_elems[bVar2].
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node.super__List_node_base._M_prev + 1);
          }
        }
        if ((((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
             &((_List_node_base *)
              (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_.
               _M_elems + bVar2))->_M_next)->_M_impl)._M_node.super__List_node_base._M_next ==
            (_List_node_base *)
            (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems
            + bVar2)) {
          __assert_fail("not buckets[c].empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                        ,0x7a,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
        }
        (&(msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems
           [bVar2].super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
           _M_node.super__List_node_base._M_prev[1]._M_next)->_M_next)[uVar14] =
             (_List_node_base *)ppuVar12[lVar11];
        (&local_830)[bVar2] = uVar3 + 1;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x20);
      uVar13 = uVar13 + 0x20;
      ppuVar12 = ppuVar12 + 0x20;
    } while (uVar13 < local_868);
  }
  if (uVar13 < n) {
    do {
      p_Var5 = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
               super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node
               .super__List_node_base._M_next;
      bVar2 = strings[uVar13][local_870];
      uVar3 = (&local_830)[bVar2];
      uVar14 = uVar3 & 0x3ff;
      if (uVar14 == 0) {
        if (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
            super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
            super__List_node_base._M_next ==
            (_List_node_base *)
            &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_) {
LAB_002040b8:
          __assert_fail("not fb.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                        ,0x47,"Block take_free_block(FreeBlocks &)");
        }
        p_Var6 = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
                 super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 _M_node.super__List_node_base._M_next[1]._M_next;
        msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
        super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
        _M_size = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node._M_size - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var5);
        p_Var5 = (_List_node_base *)operator_new(0x18);
        p_Var5[1]._M_next = p_Var6;
        std::__detail::_List_node_base::_M_hook(p_Var5);
        psVar1 = &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_.
                  _M_elems[bVar2].
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (p_Var6 < (_List_node_base *)(strings + n) && strings <= p_Var6) {
          lVar8 = (long)p_Var6 - (long)strings >> 3;
          lVar11 = lVar8 + 0x3ff;
          if (-1 < lVar8) {
            lVar11 = lVar8;
          }
          local_888.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar11 >> 10] =
               (uchar ***)
               (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_.
                _M_elems[bVar2].
                super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                _M_node.super__List_node_base._M_prev + 1);
        }
      }
      if ((((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
           &((_List_node_base *)
            (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems
            + bVar2))->_M_next)->_M_impl)._M_node.super__List_node_base._M_next ==
          (_List_node_base *)
          (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems +
          bVar2)) {
        __assert_fail("not buckets[c].empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                      ,0x88,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
      }
      (&(msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems
         [bVar2].super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
         _M_node.super__List_node_base._M_prev[1]._M_next)->_M_next)[uVar14] =
           (_List_node_base *)strings[uVar13];
      (&local_830)[bVar2] = uVar3 + 1;
      uVar13 = uVar13 + 1;
    } while (n != uVar13);
  }
  p_Var5 = (_List_node_base *)(strings + n);
  lVar11 = 0;
  uVar13 = 0;
  do {
    uVar3 = (&local_830)[lVar11];
    local_860 = lVar11;
    if (uVar3 != 0) {
      p_Var6 = (_List_node_base *)
               (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_.
                _M_elems + lVar11);
      uVar14 = 0;
      do {
        uVar15 = uVar3 - uVar14;
        if (0x3ff < uVar15) {
          uVar15 = 0x400;
        }
        p_Var6 = (((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
                  &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        p_Var9 = p_Var6[1]._M_next;
        __dest_00 = (_List_node_base *)(strings + uVar13);
        if (p_Var9 == __dest_00) {
          if ((uVar13 & 0x3ff) != 0) {
            __assert_fail("pos%B==0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                          ,0x9b,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
          }
          *(undefined8 *)
           ((long)local_888.
                  super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
                  super__Vector_impl_data._M_start + (uVar13 >> 7)) = 0;
        }
        else {
          uVar10 = (uVar15 + uVar13) - 1 >> 10;
          if (local_888.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10] != (uchar ***)0x0) {
            do {
              p_Var9 = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                       freeblocks_abi_cxx11_.
                       super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                       ._M_node.super__List_node_base._M_next;
              if (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node.super__List_node_base._M_next ==
                  (_List_node_base *)
                  &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_)
              goto LAB_002040b8;
              __dest = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                       freeblocks_abi_cxx11_.
                       super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                       ._M_node.super__List_node_base._M_next[1]._M_next;
              msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
              super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
              _M_size = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                        freeblocks_abi_cxx11_.
                        super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                        _M_impl._M_node._M_size - 1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(p_Var9);
              ppppuVar4 = local_888.
                          super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            } while ((strings <= __dest) && (__dest < __dest_00));
            local_868 = uVar13;
            if (__dest < p_Var5 && strings <= __dest) {
              lVar8 = (long)__dest - (long)strings >> 3;
              lVar11 = lVar8 + 0x3ff;
              if (-1 < lVar8) {
                lVar11 = lVar8;
              }
              if (local_888.
                  super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11 >> 10] != (uchar ***)0x0) {
                __assert_fail("backlinks[(tmp-strings)/B]==0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                              ,0xac,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
              }
              local_888.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11 >> 10] =
                   local_888.
                   super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar10];
            }
            memcpy(__dest,*local_888.
                           super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar10],0x2000);
            *ppppuVar4[uVar10] = (uchar **)__dest;
            local_888.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10] = (uchar ***)0x0;
            p_Var9 = p_Var6[1]._M_next;
            uVar13 = local_868;
          }
          if (p_Var9 < p_Var5 && strings <= p_Var9) {
            if (p_Var9 <= __dest_00) {
              __assert_fail("*it > strings+pos",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                            ,0xb5,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
            }
            lVar8 = (long)p_Var9 - (long)strings >> 3;
            lVar11 = lVar8 + 0x3ff;
            if (-1 < lVar8) {
              lVar11 = lVar8;
            }
            local_888.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar11 >> 10] = (uchar ***)0x0;
            p_Var9 = p_Var6[1]._M_next;
          }
          memcpy(__dest_00,p_Var9,uVar15 * 8);
          if (p_Var6[1]._M_next < p_Var5 && strings <= p_Var6[1]._M_next) {
            p_Var9 = (_List_node_base *)operator_new(0x18);
            p_Var9[1]._M_next = p_Var6[1]._M_next;
          }
          else {
            p_Var9 = (_List_node_base *)operator_new(0x18);
            p_Var9[1]._M_next = p_Var6[1]._M_next;
          }
          std::__detail::_List_node_base::_M_hook(p_Var9);
          msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
          super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
          _M_size = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_
                    .super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node._M_size + 1;
        }
        uVar13 = uVar13 + uVar15;
        uVar14 = uVar14 + 0x400;
      } while (uVar14 < uVar3);
    }
    lVar11 = local_860 + 1;
    p_Var6 = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
             super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
             super__List_node_base._M_next;
    if (lVar11 == 0x100) {
      while (p_Var6 != (_List_node_base *)
                       &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                        freeblocks_abi_cxx11_) {
        p_Var5 = (((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
                  &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var6);
        p_Var6 = p_Var5;
      }
      msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
      super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
      super__List_node_base._M_prev =
           (_List_node_base *)
           &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_;
      msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
      super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
      super__List_node_base._M_next =
           (_List_node_base *)
           &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_;
      msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
      super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size
           = 0;
      depth_00 = local_870 + 1;
      lVar11 = 1;
      do {
        n_00 = (&local_830)[lVar11];
        if (n_00 != 0) {
          msd_D<1024u>(strings + local_830,n_00,depth_00);
          local_830 = local_830 + n_00;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x100);
      if (local_888.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_888.
                        super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 0x10000) {
		msd_CE2_16bit(strings, n, depth);
		return;
	}
	assert(n > B);
	static Buckets buckets;
	static std::array<unsigned char*, (256+6)*B> temp_space;
	static FreeBlocks freeblocks;
	BackLinks backlinks(n/B+1);
	std::array<size_t, 256> bucketsize;

	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = 0;
		buckets[i].clear();
	}

	// Initialize our list of free blocks.
	for (size_t i=0; i < 256+6; ++i)
		freeblocks.push_back(&temp_space[i*B]);
	for (size_t i=0; i < n-B; i+=B)
		freeblocks.push_back(&strings[i]);

	// Distribute strings to buckets. Use a small cache to reduce memory
	// stalls. The exact size of the cache is not very important.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			const unsigned char c = cache[j];
			if (bucketsize[c] % B == 0) {
				Block b = take_free_block(freeblocks);
				buckets[c].push_back(b);
				// Backlinks must be set for those blocks, that
				// use the original string array space.
				if (b >= strings && b < strings+n) {
					backlinks[(b-strings)/B] = &(buckets[c].back());
				}
			}
			assert(not buckets[c].empty());
			buckets[c].back()[bucketsize[c] % B] = strings[i+j];
			++bucketsize[c];
		}
	}
	for (; i < n; ++i) {
		const unsigned char c = strings[i][depth];
		if (bucketsize[c] % B == 0) {
			Block b = take_free_block(freeblocks);
			buckets[c].push_back(b);
			if (b >= strings && b < strings+n) {
				backlinks[(b-strings)/B] = &(buckets[c].back());
			}
		}
		assert(not buckets[c].empty());
		buckets[c].back()[bucketsize[c] % B] = strings[i];
		++bucketsize[c];
	}

	// Process each bucket, and copy all strings in that bucket to proper
	// place in the original string pointer array. This means that those
	// positions that are occupied by other blocks must be moved to free
	// space etc.
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;

		Bucket::const_iterator it = buckets[i].begin();
		for (size_t bucket_pos=0; bucket_pos < bucketsize[i]; ++it, bucket_pos+=B) {
			const size_t block_items = std::min(size_t(B), bucketsize[i]-bucket_pos);
			const size_t block_overlap = (pos+block_items-1)/B;

			if (*it == (strings+pos)) {
				assert(pos%B==0);
				backlinks[pos/B] = 0;
				pos += block_items;
				continue;
			}

			// Don't overwrite the block in the position we are
			// about to write to, but copy it into safety.
			if (backlinks[block_overlap]) {
				// Take a free block. The block can be 'stale',
				// i.e. it can point to positions we have
				// already copied new strings into. Take free
				// blocks until we have non-stale block.
				Block tmp = take_free_block(freeblocks);
				while (tmp >= strings && tmp < strings+pos)
					tmp = take_free_block(freeblocks);
				if (tmp >= strings && tmp < strings+n) {
					assert(backlinks[(tmp-strings)/B]==0);
					backlinks[(tmp-strings)/B] = backlinks[block_overlap];
				}
				memcpy(tmp, *(backlinks[block_overlap]), B*sizeof(unsigned char*));
				*(backlinks[block_overlap]) = tmp;
				backlinks[block_overlap] = 0;
			}

			if (*it >= strings && *it < strings+n) {
				assert(*it > strings+pos);
				backlinks[(*it-strings)/B] = 0;
			}

			// Copy string pointers to correct position.
			memcpy(strings+pos, *it, block_items*sizeof(unsigned char*));

			// Return block for later use. Favor those in the
			// temporary space.
			if (*it >= strings && *it < strings+n) {
				freeblocks.push_back(*it);
			} else {
				freeblocks.push_front(*it);
			}

			pos += block_items;
		}
	}
	freeblocks.clear();
	backlinks.clear();
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<B>(strings+pos, bucketsize[i], depth+1);
		pos += bucketsize[i];
	}
}